

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_list.cc
# Opt level: O0

Header * __thiscall
wave::HeaderList::Iterator::operator*(Header *__return_storage_ptr__,Iterator *this)

{
  Iterator *this_local;
  Header *h;
  
  Header::Header(__return_storage_ptr__);
  Header::Init(__return_storage_ptr__,this->stream_,this->position_);
  return __return_storage_ptr__;
}

Assistant:

Header HeaderList::Iterator::operator*() {
  Header h;
  h.Init(stream_, position_);
  return h;
}